

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

bool __thiscall ASDCP::MXF::FactoryCompareUL::operator()(FactoryCompareUL *this,UL *lhs,UL *rhs)

{
  byte bVar1;
  ulong uVar2;
  byte in_CL;
  byte bVar3;
  
  uVar2 = 0;
  do {
    bVar3 = in_CL;
    if (uVar2 != 7) {
      if (uVar2 == 0x10) {
LAB_0019e652:
        return (bool)(uVar2 < 0x10 & in_CL);
      }
      bVar3 = (rhs->super_Identifier<16U>).m_Value[uVar2];
      bVar1 = (lhs->super_Identifier<16U>).m_Value[uVar2];
      in_CL = bVar1 < bVar3;
      if (bVar1 != bVar3) goto LAB_0019e652;
    }
    uVar2 = uVar2 + 1;
    in_CL = bVar3;
  } while( true );
}

Assistant:

bool operator()(const ASDCP::UL& lhs, const ASDCP::UL& rhs) const
        {
            ui32_t test_size = lhs.Size() < rhs.Size() ? lhs.Size() : rhs.Size();

            for (ui32_t i = 0; i < test_size; i++)
            {
                if (i == 7) continue; // skip version to be symmetrical with UL::operator==
                if (lhs.Value()[i] != rhs.Value()[i])
                    return lhs.Value()[i] < rhs.Value()[i];
            }

            return false;
        }